

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O2

void celero::executor::Run(string *benchmarkName,string *experimentName)

{
  string *x;
  shared_ptr<celero::Experiment> e;
  shared_ptr<celero::Benchmark> bmark;
  __shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2> local_38;
  __uniq_ptr_impl<celero::TestVector::Impl,_std::default_delete<celero::TestVector::Impl>_> local_28
  ;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  x = (string *)TestVector::Instance();
  TestVector::operator[]((TestVector *)&local_28,x);
  if (local_28._M_t.
      super__Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_>
      .super__Head_base<0UL,_celero::TestVector::Impl_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_>)
      0x0) {
    Benchmark::getExperiment
              ((Benchmark *)&local_48,
               (string *)
               local_28._M_t.
               super__Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_>
               .super__Head_base<0UL,_celero::TestVector::Impl_*,_false>._M_head_impl);
    if (local_48._M_ptr == (element_type *)0x0) {
      __assert_fail("e != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/DigitalInBlue[P]Celero/src/Executor.cpp"
                    ,0x1a0,"void celero::executor::Run(const std::string &, const std::string &)");
    }
    std::__shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,&local_48);
    Run((shared_ptr<celero::Experiment> *)&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  return;
}

Assistant:

void executor::Run(const std::string& benchmarkName, const std::string& experimentName)
{
	auto bmark = celero::TestVector::Instance()[benchmarkName];

	if(bmark != nullptr)
	{
		auto e = bmark->getExperiment(experimentName);
		assert(e != nullptr);
		executor::Run(e);
	}
}